

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O2

bool __thiscall basisu::basis_compressor::read_source_images(basis_compressor *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  vector<basisu::vector<basisu::image>_> *this_01;
  basisu_backend_slice_desc_vec *this_02;
  float fVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  vector<basisu::image_stats> *this_03;
  bool bVar9;
  byte bVar10;
  int iVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  color_rgba *pcVar13;
  color_rgba *pcVar14;
  uint8_t *puVar15;
  image *piVar16;
  vector<basisu::image> *pvVar17;
  vector<basisu::image> *pvVar18;
  uint *puVar19;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar20;
  image_stats *piVar21;
  basisu_backend_slice_desc *pbVar22;
  image *this_04;
  basisu_backend_slice_desc *pbVar23;
  uint __tmp;
  uint uVar24;
  uint32_t y;
  uint32_t uVar25;
  uint uVar26;
  uint uVar27;
  size_t sVar28;
  ulong uVar29;
  char *pcVar30;
  uint32_t x;
  uint uVar31;
  uint32_t x_2;
  ulong uVar32;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar33 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined1 auVar36 [12];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined8 extraout_XMM1_Qb;
  uint local_15c;
  uint8_t *local_158;
  uint local_13c;
  vector<basisu::image> local_138;
  uint local_11c;
  image file_image;
  image alpha_data;
  color_rgba local_c8;
  vector<basisu::image> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  vector<unsigned_int> local_a0;
  ulong local_90;
  vector<basisu::image_stats> *local_88;
  vector<basisu::image> *local_80;
  vector<unsigned_int> local_78;
  image *local_68;
  vector<basisu::image> *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  source_filenames;
  vector<basisu::image> source_images;
  
  debug_printf("basis_compressor::read_source_images\n");
  uVar27 = *(uint *)((long)&(this->m_params).m_source_filenames.m_size +
                    (ulong)(((this->m_params).m_read_source_images.m_value ^ 1) << 5));
  if (uVar27 == 0) {
    return false;
  }
  local_88 = &this->m_stats;
  vector<basisu::image_stats>::resize(local_88,0,false);
  this_02 = &this->m_slice_descs;
  vector<basisu::basisu_backend_slice_desc>::resize(this_02,0,false);
  local_60 = &this->m_slice_images;
  vector<basisu::image>::resize(local_60,0,false);
  this->m_total_blocks = 0;
  this->m_any_source_image_has_alpha = false;
  source_images.m_p = (image *)0x0;
  source_images.m_size = 0;
  source_images.m_capacity = 0;
  source_filenames.m_p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  source_filenames.m_size = 0;
  source_filenames.m_capacity = 0;
  local_80 = &(this->m_params).m_source_images;
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->m_params).m_source_filenames;
  this_00 = &(this->m_params).m_source_alpha_filenames;
  local_90 = (ulong)uVar27;
  for (sVar28 = 0; sVar28 != local_90; sVar28 = sVar28 + 1) {
    file_image.m_width = 0;
    file_image.m_height = 0;
    file_image.m_pitch = 0;
    file_image.m_pixels.m_p = (color_rgba *)0x0;
    file_image.m_pixels.m_size = 0;
    file_image.m_pixels.m_capacity = 0;
    if ((this->m_params).m_read_source_images.m_value == true) {
      pbVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_a8,sVar28);
      local_158 = (uint8_t *)(pbVar12->_M_dataplus)._M_p;
      bVar9 = load_image((char *)local_158,&file_image);
      if (bVar9) {
        if ((this->m_params).m_status_output.m_value == true) {
          printf("Read source image \"%s\", %ux%u\n",local_158,file_image._0_8_ & 0xffffffff,
                 (ulong)file_image._0_8_ >> 0x20);
        }
        if (sVar28 < (this->m_params).m_source_alpha_filenames.m_size) {
          pbVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator[](this_00,sVar28);
          if (pbVar12->_M_string_length != 0) {
            pbVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator[](this_00,sVar28);
            pcVar30 = (pbVar12->_M_dataplus)._M_p;
            alpha_data.m_width = 0;
            alpha_data.m_height = 0;
            alpha_data.m_pitch = 0;
            alpha_data.m_pixels.m_p = (color_rgba *)0x0;
            alpha_data.m_pixels.m_size = 0;
            alpha_data.m_pixels.m_capacity = 0;
            bVar9 = load_image(pcVar30,&alpha_data);
            if (bVar9) {
              printf("Read source alpha image \"%s\", %ux%u\n",pcVar30,alpha_data._0_8_ & 0xffffffff
                     ,(ulong)alpha_data._0_8_ >> 0x20);
              image::crop(&alpha_data,file_image.m_width,file_image.m_height,0xffffffff,
                          (color_rgba *)&g_black_color,true);
              for (uVar25 = 0; uVar25 < file_image.m_height; uVar25 = uVar25 + 1) {
                for (uVar31 = 0; uVar31 < file_image.m_width; uVar31 = uVar31 + 1) {
                  pcVar13 = image::operator()(&alpha_data,uVar31,uVar25);
                  iVar11 = color_rgba::get_709_luma(pcVar13);
                  pcVar13 = image::operator()(&file_image,uVar31,uVar25);
                  (pcVar13->field_0).m_comps[3] = (uint8_t)iVar11;
                }
              }
            }
            else {
              error_printf("Failed reading source image: %s\n",pcVar30);
            }
            free(alpha_data.m_pixels.m_p);
            if (!bVar9) goto LAB_002137e3;
          }
        }
        goto LAB_002133ad;
      }
      error_printf("Failed reading source image: %s\n",local_158);
LAB_002137e3:
      free(file_image.m_pixels.m_p);
      goto LAB_002137ed;
    }
    piVar16 = vector<basisu::image>::operator[](local_80,sVar28);
    image::operator=(&file_image,piVar16);
    local_158 = "";
LAB_002133ad:
    if ((this->m_params).m_renormalize.m_value == true) {
      image::renormalize_normal_map(&file_image);
    }
    auVar36 = in_XMM1._4_12_;
    uVar31 = 0;
    if (*(int *)(this->m_params).m_swizzle != 0x3020100) {
      while( true ) {
        auVar36 = in_XMM1._4_12_;
        if (file_image.m_height <= uVar31) break;
        uVar26 = 0;
        while( true ) {
          if (file_image.m_width <= uVar26) break;
          pcVar13 = image::operator()(&file_image,uVar26,uVar31);
          pcVar14 = image::operator()(&file_image,uVar26,uVar31);
          puVar15 = color_rgba::operator[](pcVar13,(int)(this->m_params).m_swizzle[0]);
          uVar2 = *puVar15;
          puVar15 = color_rgba::operator[](pcVar13,(int)(this->m_params).m_swizzle[1]);
          uVar3 = *puVar15;
          puVar15 = color_rgba::operator[](pcVar13,(int)(this->m_params).m_swizzle[2]);
          uVar4 = *puVar15;
          puVar15 = color_rgba::operator[](pcVar13,(int)(this->m_params).m_swizzle[3]);
          uVar5 = *puVar15;
          (pcVar14->field_0).m_comps[0] = uVar2;
          (pcVar14->field_0).m_comps[1] = uVar3;
          (pcVar14->field_0).m_comps[2] = uVar4;
          (pcVar14->field_0).m_comps[3] = uVar5;
          uVar26 = uVar26 + 1;
        }
        uVar31 = uVar31 + 1;
      }
      uVar31 = (uint)((this->m_params).m_swizzle[3] != '\x03');
    }
    if (((this->m_params).m_force_alpha.m_value == false) && ((char)uVar31 == '\0')) {
      if ((this->m_params).m_check_for_alpha.m_value == false) {
        image::set_alpha(&file_image,0xff);
      }
      else {
        bVar9 = image::has_alpha(&file_image);
        if (bVar9) goto LAB_002134d2;
      }
    }
    else {
LAB_002134d2:
      this->m_any_source_image_has_alpha = true;
    }
    debug_printf("Source image index %u filename %s %ux%u has alpha: %u\n",sVar28,local_158,
                 file_image._0_8_ & 0xffffffff);
    if ((this->m_params).m_y_flip.m_value == true) {
      image::flip_y(&file_image);
    }
    uVar31 = (this->m_params).m_resample_width.m_value;
    if (((int)uVar31 < 1) || (uVar26 = (this->m_params).m_resample_height.m_value, (int)uVar26 < 1))
    {
      fVar1 = (this->m_params).m_resample_factor.m_value;
      if (0.0 < fVar1) {
        auVar34._0_4_ = (float)(file_image._0_8_ & 0xffffffff) * fVar1;
        auVar34._4_12_ = auVar36;
        auVar34 = roundss(auVar34,auVar34,10);
        uVar31 = (int)auVar34._0_4_;
        if ((int)auVar34._0_4_ < 2) {
          uVar31 = 1;
        }
        if (0x3fff < (int)uVar31) {
          uVar31 = 0x4000;
        }
        auVar35._4_12_ = auVar34._4_12_;
        auVar35._0_4_ = (float)((ulong)file_image._0_8_ >> 0x20) * fVar1;
        auVar34 = roundss(ZEXT416((uint)fVar1),auVar35,10);
        uVar26 = (int)auVar34._0_4_;
        if ((int)auVar34._0_4_ < 2) {
          uVar26 = 1;
        }
        if (0x3fff < (int)uVar26) {
          uVar26 = 0x4000;
        }
        debug_printf("Resampling to %ix%i\n",(ulong)uVar31,(ulong)uVar26);
        image::image(&alpha_data,uVar31,uVar26,0xffffffff);
        image_resample(&file_image,&alpha_data,(this->m_params).m_perceptual.m_value,"box",1.0,false
                       ,0,4);
        goto LAB_00213669;
      }
    }
    else {
      if (0x3fff < uVar31) {
        uVar31 = 0x4000;
      }
      if (0x3fff < uVar26) {
        uVar26 = 0x4000;
      }
      debug_printf("Resampling to %ix%i\n",(ulong)uVar31,(ulong)uVar26);
      image::image(&alpha_data,uVar31,uVar26,0xffffffff);
      image_resample(&file_image,&alpha_data,(this->m_params).m_perceptual.m_value,"box",1.0,false,0
                     ,4);
LAB_00213669:
      image::swap(&alpha_data,&file_image);
      free(alpha_data.m_pixels.m_p);
    }
    if ((file_image.m_width == 0) || (file_image.m_height == 0)) {
      error_printf(
                  "basis_compressor::read_source_images: Source image has a zero width and/or height!\n"
                  );
      goto LAB_002137e3;
    }
    if ((0x4000 < file_image.m_width) || (0x4000 < file_image.m_height)) {
      error_printf("basis_compressor::read_source_images: Source image \"%s\" is too large!\n",
                   local_158);
      goto LAB_002137e3;
    }
    piVar16 = vector<basisu::image>::enlarge(&source_images,1);
    image::swap(piVar16,&file_image);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&alpha_data,(char *)local_158,(allocator<char> *)&local_138);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(&source_filenames,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&alpha_data);
    std::__cxx11::string::~string((string *)&alpha_data);
    in_XMM1._8_8_ = extraout_XMM1_Qb;
    in_XMM1._0_8_ = extraout_XMM1_Qa;
    free(file_image.m_pixels.m_p);
  }
  this_01 = &(this->m_params).m_source_mipmap_images;
  uVar31 = (this->m_params).m_source_mipmap_images.m_size;
  if (uVar31 == 0) {
    bVar10 = this->m_any_source_image_has_alpha;
  }
  else {
    uVar26 = (this->m_params).m_source_images.m_size;
    pcVar30 = 
    "basis_compressor::read_source_images(): m_params.m_source_mipmap_images.size() must equal m_params.m_source_images.size()!\n"
    ;
    if ((uVar26 != uVar31) || (uVar27 != uVar26)) {
LAB_00213f99:
      bVar9 = false;
      error_printf(pcVar30);
      goto LAB_002137ef;
    }
    bVar10 = this->m_any_source_image_has_alpha;
    if ((bool)bVar10 == false) {
      sVar28 = 0;
      while (sVar28 != local_90) {
        uVar32 = 0;
        while (pvVar17 = vector<basisu::vector<basisu::image>_>::operator[](this_01,sVar28),
              uVar32 < pvVar17->m_size) {
          pvVar17 = vector<basisu::vector<basisu::image>_>::operator[](this_01,sVar28);
          piVar16 = vector<basisu::image>::operator[](pvVar17,uVar32);
          bVar9 = image::has_alpha(piVar16);
          uVar32 = uVar32 + 1;
          if (bVar9) {
            this->m_any_source_image_has_alpha = true;
            bVar10 = 1;
            goto LAB_00213830;
          }
        }
        bVar10 = this->m_any_source_image_has_alpha;
        sVar28 = sVar28 + 1;
        if ((bVar10 & 1) != 0) break;
      }
    }
  }
LAB_00213830:
  debug_printf("Any source image has alpha: %u\n",(ulong)bVar10);
  sVar28 = 0;
  local_13c = 0;
  do {
    if (sVar28 == local_90) {
      debug_printf("Total blocks: %u, Total macroblocks: %u\n",(ulong)this->m_total_blocks,
                   (ulong)local_13c);
      uVar27 = (this->m_slice_descs).m_size;
      uVar32 = 1;
      if (uVar27 < 0x1000000) goto LAB_00213fa7;
      pcVar30 = "Too many slices!\n";
      goto LAB_00213f99;
    }
    local_a8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](&source_filenames,sVar28);
    local_138.m_p = (image *)0x0;
    local_138.m_size = 0;
    local_138.m_capacity = 0;
    vector<basisu::image>::reserve(&local_138,0x20);
    local_68 = vector<basisu::image>::operator[](&source_images,sVar28);
    vector<basisu::image>::resize(&local_138,1,false);
    if ((this->m_params).m_source_mipmap_images.m_size == 0) {
      if (((this->m_params).m_mip_gen.m_value != true) ||
         (bVar9 = generate_mipmaps(this,local_68,&local_138,this->m_any_source_image_has_alpha),
         bVar9)) goto LAB_00213a26;
      bVar9 = false;
    }
    else {
      for (pvVar17 = (vector<basisu::image> *)0x0;
          pvVar18 = vector<basisu::vector<basisu::image>_>::operator[](this_01,sVar28),
          pvVar17 < (vector<basisu::image> *)(ulong)pvVar18->m_size;
          pvVar17 = (vector<basisu::image> *)((long)&pvVar17->m_p + 1)) {
        pvVar18 = vector<basisu::vector<basisu::image>_>::operator[](this_01,sVar28);
        piVar16 = vector<basisu::image>::operator[](pvVar18,(size_t)pvVar17);
        if (*(int *)(this->m_params).m_swizzle != 0x3020100) {
          local_80 = pvVar17;
          for (uVar27 = 0; pvVar17 = local_80, uVar27 < piVar16->m_height; uVar27 = uVar27 + 1) {
            for (uVar31 = 0; uVar31 < piVar16->m_width; uVar31 = uVar31 + 1) {
              pcVar13 = image::operator()(piVar16,uVar31,uVar27);
              pcVar14 = image::operator()(piVar16,uVar31,uVar27);
              puVar15 = color_rgba::operator[](pcVar13,(int)(this->m_params).m_swizzle[0]);
              uVar2 = *puVar15;
              puVar15 = color_rgba::operator[](pcVar13,(int)(this->m_params).m_swizzle[1]);
              uVar3 = *puVar15;
              puVar15 = color_rgba::operator[](pcVar13,(int)(this->m_params).m_swizzle[2]);
              uVar4 = *puVar15;
              puVar15 = color_rgba::operator[](pcVar13,(int)(this->m_params).m_swizzle[3]);
              uVar5 = *puVar15;
              (pcVar14->field_0).m_comps[0] = uVar2;
              (pcVar14->field_0).m_comps[1] = uVar3;
              (pcVar14->field_0).m_comps[2] = uVar4;
              (pcVar14->field_0).m_comps[3] = uVar5;
            }
          }
        }
        vector<basisu::image>::push_back(&local_138,piVar16);
      }
LAB_00213a26:
      piVar16 = vector<basisu::image>::operator[](&local_138,0);
      image::swap(piVar16,local_68);
      vector<unsigned_int>::vector(&local_a0,local_138._8_8_ & 0xffffffff);
      uVar32 = 0;
      while( true ) {
        uVar29 = local_138._8_8_ & 0xffffffff;
        if (uVar29 <= uVar32) break;
        puVar19 = vector<unsigned_int>::operator[](&local_a0,uVar32);
        *puVar19 = (uint)uVar32;
        uVar32 = uVar32 + 1;
      }
      if ((this->m_any_source_image_has_alpha != false) &&
         ((this->m_params).m_uastc.m_value == false)) {
        local_b8.m_p = (image *)0x0;
        local_b8.m_size = 0;
        local_b8.m_capacity = 0;
        local_78.m_p = (uint *)0x0;
        local_78.m_size = 0;
        local_78.m_capacity = 0;
        vector<basisu::image>::reserve(&local_b8,(ulong)(local_138.m_size * 2));
        for (local_11c = 0; uVar8 = local_a0._8_8_, puVar19 = local_a0.m_p, uVar6 = local_138._8_8_,
            piVar16 = local_138.m_p, local_11c < local_138.m_size; local_11c = local_11c + 1) {
          piVar16 = vector<basisu::image>::operator[](&local_138,(ulong)local_11c);
          image::image(&file_image,piVar16);
          image::image(&alpha_data,&file_image);
          uVar25 = 0;
          while( true ) {
            if (alpha_data.m_height <= uVar25) break;
            for (uVar27 = 0; uVar27 < alpha_data.m_width; uVar27 = uVar27 + 1) {
              pcVar13 = image::operator()(&alpha_data,uVar27,uVar25);
              auVar34 = pmovsxbq(extraout_XMM0,0xffff);
              auVar33._8_8_ = auVar34._8_8_;
              auVar33._0_8_ =
                   auVar34._0_8_ & 0xffffffffffffff00 | (ulong)(pcVar13->field_0).m_comps[3];
              auVar34 = pshufb(auVar33,_DAT_00264400);
              paVar20 = &image::operator()(&alpha_data,uVar27,uVar25)->field_0;
              local_c8.field_0 = auVar34._0_4_;
              *paVar20 = local_c8.field_0;
            }
            uVar25 = uVar25 + 1;
          }
          image::set_alpha(&file_image,0xff);
          vector<basisu::image>::push_back(&local_b8,&file_image);
          vector<unsigned_int>::push_back(&local_78,&local_11c);
          vector<basisu::image>::push_back(&local_b8,&alpha_data);
          vector<unsigned_int>::push_back(&local_78,&local_11c);
          free(alpha_data.m_pixels.m_p);
          free(file_image.m_pixels.m_p);
        }
        local_138.m_p = local_b8.m_p;
        local_138.m_size = local_b8.m_size;
        local_138.m_capacity = local_b8.m_capacity;
        uVar7 = local_138._8_8_;
        local_b8.m_p = piVar16;
        local_138.m_size = (uint32_t)uVar6;
        local_138.m_capacity = SUB84(uVar6,4);
        local_b8.m_size = local_138.m_size;
        local_b8.m_capacity = local_138.m_capacity;
        local_a0.m_p = local_78.m_p;
        local_a0.m_size = local_78.m_size;
        local_a0.m_capacity = local_78.m_capacity;
        uVar6 = local_a0._8_8_;
        local_78.m_p = puVar19;
        local_a0.m_size = (uint32_t)uVar8;
        local_a0.m_capacity = SUB84(uVar8,4);
        local_78.m_size = local_a0.m_size;
        local_78.m_capacity = local_a0.m_capacity;
        local_138._8_8_ = uVar7;
        local_a0._8_8_ = uVar6;
        free(puVar19);
        vector<basisu::image>::~vector(&local_b8);
        uVar29 = local_138._8_8_ & 0xffffffff;
      }
      if ((uint32_t)uVar29 != local_a0.m_size) {
        __assert_fail("slices.size() == mip_indices.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                      ,0x2ec,"bool basisu::basis_compressor::read_source_images()");
      }
      for (uVar32 = 0; uVar32 < uVar29; uVar32 = uVar32 + 1) {
        piVar16 = vector<basisu::image>::operator[](&local_138,uVar32);
        uVar27 = piVar16->m_width;
        uVar31 = piVar16->m_height;
        local_15c = (uint)uVar32;
        uVar26 = uVar27;
        uVar24 = uVar31;
        if (this->m_any_source_image_has_alpha == true) {
          if ((this->m_params).m_uastc.m_value == true) {
            bVar9 = image::has_alpha(piVar16);
            local_15c = (uint)bVar9;
            uVar26 = piVar16->m_width;
            uVar24 = piVar16->m_height;
          }
        }
        else {
          local_15c = 0;
        }
        image::crop_dup_borders(piVar16,uVar26 + 3 & 0xfffffffc,uVar24 + 3 & 0xfffffffc);
        if ((this->m_params).m_debug_images.m_value == true) {
          string_format_abi_cxx11_
                    ((string *)&file_image,"basis_debug_source_image_%u_slice_%u.png",sVar28);
          save_png((char *)file_image._0_8_,piVar16,0,0);
          std::__cxx11::string::~string((string *)&file_image);
        }
        uVar29 = (ulong)(this->m_slice_images).m_size;
        enlarge_vector<basisu::vector<basisu::image_stats>>(local_88,1);
        enlarge_vector<basisu::vector<basisu::image>>(local_60,1);
        enlarge_vector<basisu::vector<basisu::basisu_backend_slice_desc>>(this_02,1);
        piVar21 = vector<basisu::image_stats>::operator[](local_88,uVar29);
        std::__cxx11::string::assign((char *)piVar21);
        this_03 = local_88;
        piVar21 = vector<basisu::image_stats>::operator[](local_88,uVar29);
        piVar21->m_width = uVar27;
        piVar21 = vector<basisu::image_stats>::operator[](this_03,uVar29);
        piVar21->m_height = uVar31;
        uVar25 = (this->m_slice_descs).m_size;
        puVar19 = vector<unsigned_int>::operator[](&local_a0,uVar32);
        debug_printf("****** Slice %u: mip %u, alpha_slice: %u, filename: \"%s\", original: %ux%u actual: %ux%u\n"
                     ,(ulong)(uVar25 - 1),(ulong)*puVar19,(ulong)(local_15c & 1),
                     (local_a8->_M_dataplus)._M_p,(ulong)uVar27,(ulong)uVar31,
                     (ulong)piVar16->m_width,(ulong)piVar16->m_height);
        pbVar22 = vector<basisu::basisu_backend_slice_desc>::operator[](this_02,uVar29);
        pbVar22->m_first_block_index = this->m_total_blocks;
        pbVar22->m_orig_width = uVar27;
        pbVar22->m_orig_height = uVar31;
        pbVar22->m_width = piVar16->m_width;
        pbVar22->m_height = piVar16->m_height;
        uVar27 = piVar16->m_width + 3;
        uVar31 = uVar27 >> 2;
        pbVar22->m_num_blocks_x = uVar31;
        uVar26 = piVar16->m_height + 3;
        uVar24 = uVar26 >> 2;
        pbVar22->m_num_blocks_y = uVar24;
        pbVar22->m_num_macroblocks_x = uVar31 - (uVar27 >> 3);
        pbVar22->m_num_macroblocks_y = uVar24 - (uVar26 >> 3);
        pbVar22->m_source_file_index = (uint32_t)sVar28;
        puVar19 = vector<unsigned_int>::operator[](&local_a0,uVar32);
        pbVar22->m_mip_index = *puVar19;
        pbVar22->m_alpha = (bool)((byte)local_15c & 1);
        pbVar22->m_iframe = false;
        pbVar22->m_iframe = (this->m_params).m_tex_type == cBASISTexTypeVideoFrames && sVar28 == 0;
        this->m_total_blocks =
             this->m_total_blocks + pbVar22->m_num_blocks_y * pbVar22->m_num_blocks_x;
        local_13c = local_13c + pbVar22->m_num_macroblocks_y * pbVar22->m_num_macroblocks_x;
        this_04 = vector<basisu::image>::operator[](local_60,uVar29);
        image::swap(this_04,piVar16);
        uVar29 = local_138._8_8_ & 0xffffffff;
      }
      free(local_a0.m_p);
      bVar9 = true;
    }
    vector<basisu::image>::~vector(&local_138);
    sVar28 = sVar28 + 1;
  } while (bVar9);
LAB_002137ed:
  bVar9 = false;
  goto LAB_002137ef;
LAB_00213fa7:
  if (uVar27 <= uVar32) goto LAB_0021400a;
  pbVar22 = vector<basisu::basisu_backend_slice_desc>::operator[](this_02,uVar32 - 1);
  pbVar23 = vector<basisu::basisu_backend_slice_desc>::operator[](this_02,uVar32);
  if ((1 < (int)(pbVar23->m_source_file_index - pbVar22->m_source_file_index)) ||
     ((pbVar23->m_source_file_index == pbVar22->m_source_file_index &&
      (1 < (int)(pbVar23->m_mip_index - pbVar22->m_mip_index))))) goto LAB_002137ed;
  uVar27 = (this->m_slice_descs).m_size;
  uVar32 = uVar32 + 1;
  goto LAB_00213fa7;
LAB_0021400a:
  if ((this->m_params).m_status_output.m_value == true) {
    printf("Total basis file slices: %u\n");
  }
  for (uVar32 = 0; bVar9 = (this->m_slice_descs).m_size <= uVar32, !bVar9; uVar32 = uVar32 + 1) {
    pbVar22 = vector<basisu::basisu_backend_slice_desc>::operator[](this_02,uVar32);
    if ((this->m_params).m_status_output.m_value == true) {
      printf("Slice: %u, alpha: %u, orig width/height: %ux%u, width/height: %ux%u, first_block: %u, image_index: %u, mip_level: %u, iframe: %u\n"
             ,uVar32 & 0xffffffff,(ulong)pbVar22->m_alpha,(ulong)pbVar22->m_orig_width,
             (ulong)pbVar22->m_orig_height,(ulong)pbVar22->m_width,(ulong)pbVar22->m_height,
             (ulong)pbVar22->m_first_block_index,(ulong)pbVar22->m_source_file_index,
             (ulong)pbVar22->m_mip_index,(ulong)pbVar22->m_iframe);
    }
    if (this->m_any_source_image_has_alpha == true) {
      if ((this->m_params).m_uastc.m_value == false) {
        if (pbVar22->m_alpha == true) {
          if ((((((uVar32 & 1) == 0) ||
                (pbVar23 = vector<basisu::basisu_backend_slice_desc>::operator[]
                                     (this_02,(ulong)((int)uVar32 - 1U & 0xfffffffe)),
                pbVar23->m_source_file_index != pbVar22->m_source_file_index)) ||
               (pbVar23->m_alpha != false)) ||
              ((pbVar23->m_mip_index != pbVar22->m_mip_index ||
               (pbVar23->m_num_blocks_x != pbVar22->m_num_blocks_x)))) ||
             (pbVar23->m_num_blocks_y != pbVar22->m_num_blocks_y)) break;
        }
        else if ((uVar32 & 1) != 0) break;
      }
    }
    else if (pbVar22->m_alpha != false) break;
    if (((pbVar22->m_width < pbVar22->m_orig_width) || (pbVar22->m_height < pbVar22->m_orig_height))
       || ((pbVar22->m_source_file_index == 0 &&
           (((this->m_params).m_tex_type == cBASISTexTypeVideoFrames && (pbVar22->m_iframe != true))
           )))) break;
  }
LAB_002137ef:
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~vector
            (&source_filenames);
  vector<basisu::image>::~vector(&source_images);
  return bVar9;
}

Assistant:

bool basis_compressor::read_source_images()
	{
		debug_printf("basis_compressor::read_source_images\n");

		const uint32_t total_source_files = m_params.m_read_source_images ? (uint32_t)m_params.m_source_filenames.size() : (uint32_t)m_params.m_source_images.size();
		if (!total_source_files)
			return false;

		m_stats.resize(0);
		m_slice_descs.resize(0);
		m_slice_images.resize(0);

		m_total_blocks = 0;
		uint32_t total_macroblocks = 0;

		m_any_source_image_has_alpha = false;

		basisu::vector<image> source_images;
		basisu::vector<std::string> source_filenames;
		
		// First load all source images, and determine if any have an alpha channel.
		for (uint32_t source_file_index = 0; source_file_index < total_source_files; source_file_index++)
		{
			const char *pSource_filename = "";

			image file_image;
			
			if (m_params.m_read_source_images)
			{
				pSource_filename = m_params.m_source_filenames[source_file_index].c_str();

				// Load the source image
				if (!load_image(pSource_filename, file_image))
				{
					error_printf("Failed reading source image: %s\n", pSource_filename);
					return false;
				}

				if (m_params.m_status_output)
				{
					printf("Read source image \"%s\", %ux%u\n", pSource_filename, file_image.get_width(), file_image.get_height());
				}

				// Optionally load another image and put a grayscale version of it into the alpha channel.
				if ((source_file_index < m_params.m_source_alpha_filenames.size()) && (m_params.m_source_alpha_filenames[source_file_index].size()))
				{
					const char *pSource_alpha_image = m_params.m_source_alpha_filenames[source_file_index].c_str();

					image alpha_data;

					if (!load_image(pSource_alpha_image, alpha_data))
					{
						error_printf("Failed reading source image: %s\n", pSource_alpha_image);
						return false;
					}

					printf("Read source alpha image \"%s\", %ux%u\n", pSource_alpha_image, alpha_data.get_width(), alpha_data.get_height());

					alpha_data.crop(file_image.get_width(), file_image.get_height());

					for (uint32_t y = 0; y < file_image.get_height(); y++)
						for (uint32_t x = 0; x < file_image.get_width(); x++)
							file_image(x, y).a = (uint8_t)alpha_data(x, y).get_709_luma();
				}
			}
			else
			{
				file_image = m_params.m_source_images[source_file_index];
			}

			if (m_params.m_renormalize)
				file_image.renormalize_normal_map();

			bool alpha_swizzled = false;
			if (m_params.m_swizzle[0] != 0 ||
				m_params.m_swizzle[1] != 1 ||
				m_params.m_swizzle[2] != 2 ||
				m_params.m_swizzle[3] != 3)
			{
				// Used for XY normal maps in RG - puts X in color, Y in alpha
				for (uint32_t y = 0; y < file_image.get_height(); y++)
					for (uint32_t x = 0; x < file_image.get_width(); x++)
					{
						const color_rgba &c = file_image(x, y);
						file_image(x, y).set_noclamp_rgba(c[m_params.m_swizzle[0]], c[m_params.m_swizzle[1]], c[m_params.m_swizzle[2]], c[m_params.m_swizzle[3]]);
					}
				alpha_swizzled = m_params.m_swizzle[3] != 3;
			}
						
			bool has_alpha = false;
			if (m_params.m_force_alpha || alpha_swizzled)
				has_alpha = true;
			else if (!m_params.m_check_for_alpha)
				file_image.set_alpha(255);
			else if (file_image.has_alpha())
				has_alpha = true;

			if (has_alpha)
				m_any_source_image_has_alpha = true;

			debug_printf("Source image index %u filename %s %ux%u has alpha: %u\n", source_file_index, pSource_filename, file_image.get_width(), file_image.get_height(), has_alpha);
												
			if (m_params.m_y_flip)
				file_image.flip_y();

#if DEBUG_EXTRACT_SINGLE_BLOCK
			image block_image(4, 4);
			const uint32_t block_x = 0;
			const uint32_t block_y = 0;
			block_image.blit(block_x * 4, block_y * 4, 4, 4, 0, 0, file_image, 0);
			file_image = block_image;
#endif

#if DEBUG_CROP_TEXTURE_TO_64x64
			file_image.resize(64, 64);
#endif

			if (m_params.m_resample_width > 0 && m_params.m_resample_height > 0)
			{
				int new_width = basisu::minimum<int>(m_params.m_resample_width, BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION);
				int new_height = basisu::minimum<int>(m_params.m_resample_height, BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION);

				debug_printf("Resampling to %ix%i\n", new_width, new_height);

				// TODO: A box filter - kaiser looks too sharp on video. Let the caller control this.
				image temp_img(new_width, new_height);
				image_resample(file_image, temp_img, m_params.m_perceptual, "box"); // "kaiser");
				temp_img.swap(file_image);
			}
			else if (m_params.m_resample_factor > 0.0f)
			{
				int new_width = basisu::minimum<int>(basisu::maximum(1, (int)ceilf(file_image.get_width() * m_params.m_resample_factor)), BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION);
				int new_height = basisu::minimum<int>(basisu::maximum(1, (int)ceilf(file_image.get_height() * m_params.m_resample_factor)), BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION);

				debug_printf("Resampling to %ix%i\n", new_width, new_height);

				// TODO: A box filter - kaiser looks too sharp on video. Let the caller control this.
				image temp_img(new_width, new_height);
				image_resample(file_image, temp_img, m_params.m_perceptual, "box"); // "kaiser");
				temp_img.swap(file_image);
			}

			if ((!file_image.get_width()) || (!file_image.get_height()))
			{
				error_printf("basis_compressor::read_source_images: Source image has a zero width and/or height!\n");
				return false;
			}

			if ((file_image.get_width() > BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION) || (file_image.get_height() > BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION))
			{
				error_printf("basis_compressor::read_source_images: Source image \"%s\" is too large!\n", pSource_filename);
				return false;
			}

			source_images.enlarge(1)->swap(file_image);
			source_filenames.push_back(pSource_filename);
		}

		// Check if the caller has generated their own mipmaps. 
		if (m_params.m_source_mipmap_images.size())
		{
			// Make sure they've passed us enough mipmap chains.
			if ((m_params.m_source_images.size() != m_params.m_source_mipmap_images.size()) || (total_source_files != m_params.m_source_images.size()))
			{
				error_printf("basis_compressor::read_source_images(): m_params.m_source_mipmap_images.size() must equal m_params.m_source_images.size()!\n");
				return false;
			}

			// Check if any of the user-supplied mipmap levels has alpha.
			// We're assuming the user has already preswizzled their mipmap source images.
			if (!m_any_source_image_has_alpha)
			{
				for (uint32_t source_file_index = 0; source_file_index < total_source_files; source_file_index++)
				{
					for (uint32_t mip_index = 0; mip_index < m_params.m_source_mipmap_images[source_file_index].size(); mip_index++)
					{
						const image& mip_img = m_params.m_source_mipmap_images[source_file_index][mip_index];

						if (mip_img.has_alpha())
						{
							m_any_source_image_has_alpha = true;
							break;
						}
					}

					if (m_any_source_image_has_alpha)
						break;
				}
			}
		}

		debug_printf("Any source image has alpha: %u\n", m_any_source_image_has_alpha);

		for (uint32_t source_file_index = 0; source_file_index < total_source_files; source_file_index++)
		{
			const std::string &source_filename = source_filenames[source_file_index];

			// Now, for each source image, create the slices corresponding to that image.
			basisu::vector<image> slices;
			
			slices.reserve(32);
						
			// The first (largest) mipmap level.
			image& file_image = source_images[source_file_index];
						
			// Reserve a slot for mip0.
			slices.resize(1);
												
			if (m_params.m_source_mipmap_images.size())
			{
				// User-provided mipmaps for each layer or image in the texture array.
				for (uint32_t mip_index = 0; mip_index < m_params.m_source_mipmap_images[source_file_index].size(); mip_index++)
				{
					image& mip_img = m_params.m_source_mipmap_images[source_file_index][mip_index];

					if (m_params.m_swizzle[0] != 0 ||
						m_params.m_swizzle[1] != 1 ||
						m_params.m_swizzle[2] != 2 ||
						m_params.m_swizzle[3] != 3)
					{
						// Used for XY normal maps in RG - puts X in color, Y in alpha
						for (uint32_t y = 0; y < mip_img.get_height(); y++)
							for (uint32_t x = 0; x < mip_img.get_width(); x++)
							{
								const color_rgba &c = mip_img(x, y);
								mip_img(x, y).set_noclamp_rgba(c[m_params.m_swizzle[0]], c[m_params.m_swizzle[1]], c[m_params.m_swizzle[2]], c[m_params.m_swizzle[3]]);
							}
					}

					slices.push_back(mip_img);
				}
			}
			else if (m_params.m_mip_gen)
			{
				// Automatically generate mipmaps.
				if (!generate_mipmaps(file_image, slices, m_any_source_image_has_alpha))
					return false;
			}

			// Swap in the largest mipmap level here to avoid copying it, because generate_mips() will change the array.
			// NOTE: file_image is now blank.
			slices[0].swap(file_image);

			uint_vec mip_indices(slices.size());
			for (uint32_t i = 0; i < slices.size(); i++)
				mip_indices[i] = i;
						
			if ((m_any_source_image_has_alpha) && (!m_params.m_uastc))
			{
				// For ETC1S, if source has alpha, then even mips will have RGB, and odd mips will have alpha in RGB. 
				basisu::vector<image> alpha_slices;
				uint_vec new_mip_indices;

				alpha_slices.reserve(slices.size() * 2);

				for (uint32_t i = 0; i < slices.size(); i++)
				{
					image lvl_rgb(slices[i]);
					image lvl_a(lvl_rgb);

					for (uint32_t y = 0; y < lvl_a.get_height(); y++)
					{
						for (uint32_t x = 0; x < lvl_a.get_width(); x++)
						{
							uint8_t a = lvl_a(x, y).a;
							lvl_a(x, y).set_noclamp_rgba(a, a, a, 255);
						}
					}
					
					lvl_rgb.set_alpha(255);

					alpha_slices.push_back(lvl_rgb);
					new_mip_indices.push_back(i);

					alpha_slices.push_back(lvl_a);
					new_mip_indices.push_back(i);
				}

				slices.swap(alpha_slices);
				mip_indices.swap(new_mip_indices);
			}

			assert(slices.size() == mip_indices.size());
						
			for (uint32_t slice_index = 0; slice_index < slices.size(); slice_index++)
			{
				image& slice_image = slices[slice_index];
				const uint32_t orig_width = slice_image.get_width();
				const uint32_t orig_height = slice_image.get_height();

				bool is_alpha_slice = false;
				if (m_any_source_image_has_alpha)
				{
					if (m_params.m_uastc)
					{
						is_alpha_slice = slice_image.has_alpha();
					}
					else
					{
						is_alpha_slice = (slice_index & 1) != 0;
					}
				}

				// Enlarge the source image to 4x4 block boundaries, duplicating edge pixels if necessary to avoid introducing extra colors into blocks.
				slice_image.crop_dup_borders(slice_image.get_block_width(4) * 4, slice_image.get_block_height(4) * 4);

				if (m_params.m_debug_images)
				{
					save_png(string_format("basis_debug_source_image_%u_slice_%u.png", source_file_index, slice_index).c_str(), slice_image);
				}

				const uint32_t dest_image_index = m_slice_images.size();

				enlarge_vector(m_stats, 1);
				enlarge_vector(m_slice_images, 1);
				enlarge_vector(m_slice_descs, 1);
								
				m_stats[dest_image_index].m_filename = source_filename.c_str();
				m_stats[dest_image_index].m_width = orig_width;
				m_stats[dest_image_index].m_height = orig_height;
								
				debug_printf("****** Slice %u: mip %u, alpha_slice: %u, filename: \"%s\", original: %ux%u actual: %ux%u\n", m_slice_descs.size() - 1, mip_indices[slice_index], is_alpha_slice, source_filename.c_str(), orig_width, orig_height, slice_image.get_width(), slice_image.get_height());

				basisu_backend_slice_desc &slice_desc = m_slice_descs[dest_image_index];

				slice_desc.m_first_block_index = m_total_blocks;

				slice_desc.m_orig_width = orig_width;
				slice_desc.m_orig_height = orig_height;

				slice_desc.m_width = slice_image.get_width();
				slice_desc.m_height = slice_image.get_height();

				slice_desc.m_num_blocks_x = slice_image.get_block_width(4);
				slice_desc.m_num_blocks_y = slice_image.get_block_height(4);

				slice_desc.m_num_macroblocks_x = (slice_desc.m_num_blocks_x + 1) >> 1;
				slice_desc.m_num_macroblocks_y = (slice_desc.m_num_blocks_y + 1) >> 1;

				slice_desc.m_source_file_index = source_file_index;
				
				slice_desc.m_mip_index = mip_indices[slice_index];

				slice_desc.m_alpha = is_alpha_slice;
				slice_desc.m_iframe = false;
				if (m_params.m_tex_type == basist::cBASISTexTypeVideoFrames)
				{
					slice_desc.m_iframe = (source_file_index == 0);
				}

				m_total_blocks += slice_desc.m_num_blocks_x * slice_desc.m_num_blocks_y;
				total_macroblocks += slice_desc.m_num_macroblocks_x * slice_desc.m_num_macroblocks_y;

				// Finally, swap in the slice's image to avoid copying it.
				// NOTE: slice_image is now blank.
				m_slice_images[dest_image_index].swap(slice_image);
			
			} // slice_index

		} // source_file_index

		debug_printf("Total blocks: %u, Total macroblocks: %u\n", m_total_blocks, total_macroblocks);

		// Make sure we don't have too many slices
		if (m_slice_descs.size() > BASISU_MAX_SLICES)
		{
			error_printf("Too many slices!\n");
			return false;
		}
				
		// Basic sanity check on the slices
		for (uint32_t i = 1; i < m_slice_descs.size(); i++)
		{
			const basisu_backend_slice_desc &prev_slice_desc = m_slice_descs[i - 1];
			const basisu_backend_slice_desc &slice_desc = m_slice_descs[i];

			// Make sure images are in order
			int image_delta = (int)slice_desc.m_source_file_index - (int)prev_slice_desc.m_source_file_index;
			if (image_delta > 1)
				return false;	

			// Make sure mipmap levels are in order
			if (!image_delta)
			{
				int level_delta = (int)slice_desc.m_mip_index - (int)prev_slice_desc.m_mip_index;
				if (level_delta > 1)
					return false;
			}
		}

		if (m_params.m_status_output)
		{
			printf("Total basis file slices: %u\n", (uint32_t)m_slice_descs.size());
		}

		for (uint32_t i = 0; i < m_slice_descs.size(); i++)
		{
			const basisu_backend_slice_desc &slice_desc = m_slice_descs[i];

			if (m_params.m_status_output)
			{
				printf("Slice: %u, alpha: %u, orig width/height: %ux%u, width/height: %ux%u, first_block: %u, image_index: %u, mip_level: %u, iframe: %u\n",
					i, slice_desc.m_alpha, slice_desc.m_orig_width, slice_desc.m_orig_height, slice_desc.m_width, slice_desc.m_height, slice_desc.m_first_block_index, slice_desc.m_source_file_index, slice_desc.m_mip_index, slice_desc.m_iframe);
			}

			if (m_any_source_image_has_alpha)
			{
				if (!m_params.m_uastc)
				{
					// For ETC1S, alpha slices must be at odd slice indices.
					if (slice_desc.m_alpha)
					{
						if ((i & 1) == 0)
							return false;

						const basisu_backend_slice_desc& prev_slice_desc = m_slice_descs[i - 1];

						// Make sure previous slice has this image's color data
						if (prev_slice_desc.m_source_file_index != slice_desc.m_source_file_index)
							return false;
						if (prev_slice_desc.m_alpha)
							return false;
						if (prev_slice_desc.m_mip_index != slice_desc.m_mip_index)
							return false;
						if (prev_slice_desc.m_num_blocks_x != slice_desc.m_num_blocks_x)
							return false;
						if (prev_slice_desc.m_num_blocks_y != slice_desc.m_num_blocks_y)
							return false;
					}
					else if (i & 1)
						return false;
				}
			}
			else if (slice_desc.m_alpha)
			{
				return false;
			}

			if ((slice_desc.m_orig_width > slice_desc.m_width) || (slice_desc.m_orig_height > slice_desc.m_height))
				return false;
			if ((slice_desc.m_source_file_index == 0) && (m_params.m_tex_type == basist::cBASISTexTypeVideoFrames))
			{
				if (!slice_desc.m_iframe)
					return false;
			}
		}

		return true;
	}